

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O0

int mbedtls_pkcs12_pbe(mbedtls_asn1_buf *pbe_params,int mode,mbedtls_cipher_type_t cipher_type,
                      mbedtls_md_type_t md_type,uchar *pwd,size_t pwdlen,uchar *data,size_t len,
                      uchar *output)

{
  uint uVar1;
  size_t local_e0;
  size_t olen;
  mbedtls_cipher_context_t cipher_ctx;
  mbedtls_cipher_info_t *cipher_info;
  uchar iv [16];
  uchar key [32];
  int local_3c;
  int keylen;
  int ret;
  size_t pwdlen_local;
  uchar *pwd_local;
  mbedtls_md_type_t md_type_local;
  mbedtls_cipher_type_t cipher_type_local;
  int mode_local;
  mbedtls_asn1_buf *pbe_params_local;
  
  local_e0 = 0;
  cipher_ctx.cipher_ctx = mbedtls_cipher_info_from_type(cipher_type);
  if ((mbedtls_cipher_info_t *)cipher_ctx.cipher_ctx == (mbedtls_cipher_info_t *)0x0) {
    pbe_params_local._4_4_ = -0x1f00;
  }
  else {
    uVar1 = ((mbedtls_cipher_info_t *)cipher_ctx.cipher_ctx)->key_bitlen >> 3;
    pbe_params_local._4_4_ =
         pkcs12_pbe_derive_key_iv
                   (pbe_params,md_type,pwd,pwdlen,iv + 8,(long)(int)uVar1,(uchar *)&cipher_info,
                    (ulong)((mbedtls_cipher_info_t *)cipher_ctx.cipher_ctx)->iv_size);
    if (pbe_params_local._4_4_ == 0) {
      mbedtls_cipher_init((mbedtls_cipher_context_t *)&olen);
      local_3c = mbedtls_cipher_setup
                           ((mbedtls_cipher_context_t *)&olen,
                            (mbedtls_cipher_info_t *)cipher_ctx.cipher_ctx);
      if ((((local_3c == 0) &&
           (local_3c = mbedtls_cipher_setkey
                                 ((mbedtls_cipher_context_t *)&olen,iv + 8,uVar1 << 3,mode),
           local_3c == 0)) &&
          (local_3c = mbedtls_cipher_set_iv
                                ((mbedtls_cipher_context_t *)&olen,(uchar *)&cipher_info,
                                 (ulong)*(uint *)((long)cipher_ctx.cipher_ctx + 0x18)),
          local_3c == 0)) &&
         (((local_3c = mbedtls_cipher_reset((mbedtls_cipher_context_t *)&olen), local_3c == 0 &&
           (local_3c = mbedtls_cipher_update
                                 ((mbedtls_cipher_context_t *)&olen,data,len,output,&local_e0),
           local_3c == 0)) &&
          (local_3c = mbedtls_cipher_finish
                                ((mbedtls_cipher_context_t *)&olen,output + local_e0,&local_e0),
          local_3c != 0)))) {
        local_3c = -0x1e00;
      }
      mbedtls_zeroize(iv + 8,0x20);
      mbedtls_zeroize(&cipher_info,0x10);
      mbedtls_cipher_free((mbedtls_cipher_context_t *)&olen);
      pbe_params_local._4_4_ = local_3c;
    }
  }
  return pbe_params_local._4_4_;
}

Assistant:

int mbedtls_pkcs12_pbe( mbedtls_asn1_buf *pbe_params, int mode,
                mbedtls_cipher_type_t cipher_type, mbedtls_md_type_t md_type,
                const unsigned char *pwd,  size_t pwdlen,
                const unsigned char *data, size_t len,
                unsigned char *output )
{
    int ret, keylen = 0;
    unsigned char key[32];
    unsigned char iv[16];
    const mbedtls_cipher_info_t *cipher_info;
    mbedtls_cipher_context_t cipher_ctx;
    size_t olen = 0;

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );

    keylen = cipher_info->key_bitlen / 8;

    if( ( ret = pkcs12_pbe_derive_key_iv( pbe_params, md_type, pwd, pwdlen,
                                          key, keylen,
                                          iv, cipher_info->iv_size ) ) != 0 )
    {
        return( ret );
    }

    mbedtls_cipher_init( &cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_setkey( &cipher_ctx, key, 8 * keylen, (mbedtls_operation_t) mode ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_set_iv( &cipher_ctx, iv, cipher_info->iv_size ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_reset( &cipher_ctx ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_update( &cipher_ctx, data, len,
                                output, &olen ) ) != 0 )
    {
        goto exit;
    }

    if( ( ret = mbedtls_cipher_finish( &cipher_ctx, output + olen, &olen ) ) != 0 )
        ret = MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH;

exit:
    mbedtls_zeroize( key, sizeof( key ) );
    mbedtls_zeroize( iv,  sizeof( iv  ) );
    mbedtls_cipher_free( &cipher_ctx );

    return( ret );
}